

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FillStaticLayerParams::SerializeWithCachedSizes
          (FillStaticLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  uint64 value;
  float fVar2;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FillStaticLayerParams *this_local;
  
  fVar2 = FillStaticLayerParams::value(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = FillStaticLayerParams::value(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar2,output);
  }
  iVar1 = targetshape_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_targetshape_cached_byte_size_);
  }
  local_20 = 0;
  iVar1 = targetshape_size(this);
  for (; local_20 < iVar1; local_20 = local_20 + 1) {
    value = targetshape(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(value,output);
  }
  return;
}

Assistant:

void FillStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FillStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float value = 1;
  if (this->value() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->value(), output);
  }

  // repeated uint64 targetShape = 2;
  if (this->targetshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_targetshape_cached_byte_size_);
  }
  for (int i = 0, n = this->targetshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->targetshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FillStaticLayerParams)
}